

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  undefined8 uVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  bool bVar10;
  type_conflict5 tVar11;
  type_conflict5 tVar12;
  int iVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> *local_180;
  long local_178;
  int *local_170;
  int *local_168;
  int *local_160;
  pointer local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  long local_148;
  int *local_140;
  long local_138;
  int *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems._32_5_ = 0;
  local_1b8.data._M_elems[9]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  local_158 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_160 = (this->l).idx;
  piVar17 = (this->l).row;
  local_170 = (this->l).start;
  lVar18 = (long)(this->l).firstUnused;
  local_178 = lVar18;
  local_168 = piVar17;
  local_150 = eps;
  local_140 = ridx;
  for (lVar16 = (long)(this->l).firstUpdate; lVar16 < lVar18; lVar16 = lVar16 + 1) {
    iVar13 = piVar17[lVar16];
    local_e8.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar13].m_backend.data._M_elems + 8);
    local_e8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar13].m_backend.data._M_elems;
    local_e8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar13].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 4;
    local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_128.m_backend.exp = vec[iVar13].m_backend.exp;
    local_128.m_backend.neg = vec[iVar13].m_backend.neg;
    local_128.m_backend.fpclass = vec[iVar13].m_backend.fpclass;
    local_128.m_backend.prec_elem = vec[iVar13].m_backend.prec_elem;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar13].m_backend.data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(vec[iVar13].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar13].m_backend.data._M_elems + 4;
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(vec[iVar13].m_backend.data._M_elems + 8);
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_a8.m_backend.exp = (eps->m_backend).exp;
    local_a8.m_backend.neg = (eps->m_backend).neg;
    local_a8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    local_e8.exp = local_128.m_backend.exp;
    local_e8.neg = local_128.m_backend.neg;
    local_e8.fpclass = local_128.m_backend.fpclass;
    local_e8.prec_elem = local_128.m_backend.prec_elem;
    bVar10 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_128,&local_a8);
    if (bVar10) {
      local_138 = (long)local_170[lVar16];
      piVar15 = local_160 + local_138;
      local_180 = &local_158[local_138].m_backend;
      iVar13 = local_170[lVar16 + 1];
      local_148 = lVar16;
      while( true ) {
        eps = local_150;
        lVar16 = local_148;
        piVar17 = local_168;
        lVar18 = local_178;
        if (iVar13 <= (int)local_138) break;
        iVar2 = *piVar15;
        local_140[n] = iVar2;
        uVar5 = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 8);
        local_1b8.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_1b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_1b8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
        local_1b8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
        puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
        local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_1b8.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_1b8.exp = vec[iVar2].m_backend.exp;
        local_1b8.neg = vec[iVar2].m_backend.neg;
        local_1b8.fpclass = vec[iVar2].m_backend.fpclass;
        local_1b8.prec_elem = vec[iVar2].m_backend.prec_elem;
        local_1f8.data._M_elems._0_8_ = local_1f8.data._M_elems._0_8_ & 0xffffffff00000000;
        local_130 = piVar15;
        tVar11 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1b8,(int *)&local_1f8);
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,&local_e8,local_180);
        local_1f8.fpclass = cpp_dec_float_finite;
        local_1f8.prec_elem = 10;
        local_1f8.data._M_elems[0] = 0;
        local_1f8.data._M_elems[1] = 0;
        local_1f8.data._M_elems[2] = 0;
        local_1f8.data._M_elems[3] = 0;
        local_1f8.data._M_elems[4] = 0;
        local_1f8.data._M_elems[5] = 0;
        local_1f8.data._M_elems._24_5_ = 0;
        local_1f8.data._M_elems[7]._1_3_ = 0;
        local_1f8.data._M_elems._32_5_ = 0;
        local_1f8.data._M_elems[9]._1_3_ = 0;
        local_1f8.exp = 0;
        local_1f8.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1f8,&local_1b8,&local_68);
        local_1b8.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
        local_1b8.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
        local_1b8.data._M_elems[4] = local_1f8.data._M_elems[4];
        local_1b8.data._M_elems[5] = local_1f8.data._M_elems[5];
        local_1b8.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
        local_1b8.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
        local_1b8.data._M_elems[0] = local_1f8.data._M_elems[0];
        local_1b8.data._M_elems[1] = local_1f8.data._M_elems[1];
        local_1b8.data._M_elems[2] = local_1f8.data._M_elems[2];
        local_1b8.data._M_elems[3] = local_1f8.data._M_elems[3];
        local_1b8.exp = local_1f8.exp;
        local_1b8.neg = local_1f8.neg;
        local_1b8.fpclass = local_1f8.fpclass;
        local_1b8.prec_elem = local_1f8.prec_elem;
        local_68.data._M_elems._0_8_ = local_68.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar12 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1b8,(int *)&local_68);
        if (tVar12) {
          local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
          local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
          local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
          local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
          local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
          pcVar6 = &local_1b8;
          pcVar7 = &local_1b8;
          pcVar8 = &local_1b8;
          pcVar9 = &local_1b8;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_1f8,1e-100,(type *)0x0);
          pcVar6 = &local_1f8;
          pcVar7 = &local_1f8;
          pcVar8 = &local_1f8;
          pcVar9 = &local_1f8;
        }
        piVar15 = local_130 + 1;
        pnVar14 = vec + iVar2;
        n = n + (uint)tVar11;
        local_180 = local_180 + 1;
        iVar2 = pcVar6->exp;
        bVar10 = pcVar7->neg;
        fVar3 = pcVar8->fpclass;
        iVar4 = pcVar9->prec_elem;
        *(ulong *)((pnVar14->m_backend).data._M_elems + 8) =
             CONCAT35(local_1f8.data._M_elems[9]._1_3_,local_1f8.data._M_elems._32_5_);
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 4) = local_1f8.data._M_elems._16_8_;
        *(ulong *)((pnVar14->m_backend).data._M_elems + 6) =
             CONCAT35(local_1f8.data._M_elems[7]._1_3_,local_1f8.data._M_elems._24_5_);
        *(undefined8 *)(pnVar14->m_backend).data._M_elems = local_1f8.data._M_elems._0_8_;
        *(undefined8 *)((pnVar14->m_backend).data._M_elems + 2) = local_1f8.data._M_elems._8_8_;
        (pnVar14->m_backend).exp = iVar2;
        (pnVar14->m_backend).neg = bVar10;
        (pnVar14->m_backend).fpclass = fVar3;
        (pnVar14->m_backend).prec_elem = iVar4;
        iVar13 = iVar13 + -1;
      }
    }
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}